

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::Base64EscapeInternal
              (uchar *src,int szsrc,char *dest,int szdest,char *base64,bool do_padding)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  LogMessage *pLVar7;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  uint *puVar11;
  int iVar12;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (szsrc < 1) {
    return 0;
  }
  iVar12 = szsrc * 4;
  if (iVar12 == szdest * 3 || SBORROW4(iVar12,szdest * 3) != iVar12 + szdest * -3 < 0) {
    puVar11 = (uint *)(src + ((ulong)(uint)szsrc - 3));
    lVar6 = 0;
    for (; src < puVar11; src = (uchar *)((long)src + 3)) {
      uVar10 = *(uint *)src;
      uVar3 = (uVar10 & 0xff0000) >> 8;
      uVar2 = uVar3 | (uVar10 & 0xff00) << 8;
      dest[lVar6] = base64[(uVar10 << 0x18) >> 0x1a];
      dest[lVar6 + 1] = base64[(uVar2 | uVar10 << 0x18) >> 0x14 & 0x3f];
      dest[lVar6 + 2] = base64[(uVar2 & 0xfc000) >> 0xe];
      dest[lVar6 + 3] = base64[(uVar3 & 0x3f00) >> 8];
      szsrc = szsrc - 3;
      lVar6 = lVar6 + 4;
    }
    iVar4 = (int)dest;
    iVar5 = (int)lVar6;
    iVar12 = iVar4 + iVar5;
    if ((uint)szsrc < 4) {
      uVar10 = szdest - iVar5;
      switch(szsrc) {
      case 1:
        if ((int)uVar10 < 2) {
          return 0;
        }
        uVar2 = *(uint *)src;
        dest[lVar6] = base64[(byte)((byte)uVar2 >> 2)];
        dest[lVar6 + 1] = base64[((byte)uVar2 & 3) << 4];
        if (do_padding) {
          if (uVar10 < 4) {
            return 0;
          }
          pcVar1 = dest + lVar6;
          iVar12 = (int)pcVar1 + 4;
          pcVar1[2] = '=';
          pcVar1[3] = '=';
        }
        else {
          iVar12 = iVar4 + iVar5 + 2;
        }
        break;
      case 2:
        if ((int)uVar10 < 3) {
          return 0;
        }
        uVar9 = (ushort)*(uint *)src << 8;
        uVar8 = uVar9 | (ushort)*(uint *)src >> 8;
        dest[lVar6] = base64[uVar9 >> 10];
        dest[lVar6 + 1] = base64[uVar8 >> 4 & 0x3f];
        dest[lVar6 + 2] = base64[(ulong)(uVar8 & 0xf) * 4];
        if (do_padding) {
          if (szdest + -3 == iVar5) {
            return 0;
          }
          iVar12 = (int)(dest + lVar6) + 4;
          (dest + lVar6)[3] = '=';
        }
        else {
          iVar12 = iVar4 + iVar5 + 3;
        }
        break;
      case 3:
        if ((int)uVar10 < 4) {
          return 0;
        }
        uVar10 = *(uint *)src;
        uVar9 = *(ushort *)((long)src + 1) << 8 | *(ushort *)((long)src + 1) >> 8;
        pcVar1 = dest + lVar6;
        iVar12 = (int)pcVar1 + 4;
        *pcVar1 = base64[(byte)((byte)uVar10 >> 2)];
        pcVar1[1] = base64[(((byte)uVar10 & 3) << 0x10 | (uint)uVar9) >> 0xc];
        pcVar1[2] = base64[uVar9 >> 6 & 0x3f];
        pcVar1[3] = base64[uVar9 & 0x3f];
      }
    }
    else {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                 ,0x887);
      pLVar7 = internal::LogMessage::operator<<(&local_58,"Logic problem? szsrc = ");
      pLVar7 = internal::LogMessage::operator<<(pLVar7,szsrc);
      internal::LogFinisher::operator=(&local_59,pLVar7);
      internal::LogMessage::~LogMessage(&local_58);
    }
    return iVar12 - iVar4;
  }
  return 0;
}

Assistant:

int Base64EscapeInternal(const unsigned char *src, int szsrc,
                         char *dest, int szdest, const char *base64,
                         bool do_padding) {
  static const char kPad64 = '=';

  if (szsrc <= 0) return 0;

  if (szsrc * 4 > szdest * 3) return 0;

  char *cur_dest = dest;
  const unsigned char *cur_src = src;

  char *limit_dest = dest + szdest;
  const unsigned char *limit_src = src + szsrc;

  // Three bytes of data encodes to four characters of ciphertext.
  // So we can pump through three-byte chunks atomically.
  while (cur_src < limit_src - 3) {  // keep going as long as we have >= 32 bits
    uint32 in = BigEndian::Load32(cur_src) >> 8;

    cur_dest[0] = base64[in >> 18];
    in &= 0x3FFFF;
    cur_dest[1] = base64[in >> 12];
    in &= 0xFFF;
    cur_dest[2] = base64[in >> 6];
    in &= 0x3F;
    cur_dest[3] = base64[in];

    cur_dest += 4;
    cur_src += 3;
  }
  // To save time, we didn't update szdest or szsrc in the loop.  So do it now.
  szdest = limit_dest - cur_dest;
  szsrc = limit_src - cur_src;

  /* now deal with the tail (<=3 bytes) */
  switch (szsrc) {
    case 0:
      // Nothing left; nothing more to do.
      break;
    case 1: {
      // One byte left: this encodes to two characters, and (optionally)
      // two pad characters to round out the four-character cipherblock.
      if ((szdest -= 2) < 0) return 0;
      uint32 in = cur_src[0];
      cur_dest[0] = base64[in >> 2];
      in &= 0x3;
      cur_dest[1] = base64[in << 4];
      cur_dest += 2;
      if (do_padding) {
        if ((szdest -= 2) < 0) return 0;
        cur_dest[0] = kPad64;
        cur_dest[1] = kPad64;
        cur_dest += 2;
      }
      break;
    }
    case 2: {
      // Two bytes left: this encodes to three characters, and (optionally)
      // one pad character to round out the four-character cipherblock.
      if ((szdest -= 3) < 0) return 0;
      uint32 in = BigEndian::Load16(cur_src);
      cur_dest[0] = base64[in >> 10];
      in &= 0x3FF;
      cur_dest[1] = base64[in >> 4];
      in &= 0x00F;
      cur_dest[2] = base64[in << 2];
      cur_dest += 3;
      if (do_padding) {
        if ((szdest -= 1) < 0) return 0;
        cur_dest[0] = kPad64;
        cur_dest += 1;
      }
      break;
    }
    case 3: {
      // Three bytes left: same as in the big loop above.  We can't do this in
      // the loop because the loop above always reads 4 bytes, and the fourth
      // byte is past the end of the input.
      if ((szdest -= 4) < 0) return 0;
      uint32 in = (cur_src[0] << 16) + BigEndian::Load16(cur_src + 1);
      cur_dest[0] = base64[in >> 18];
      in &= 0x3FFFF;
      cur_dest[1] = base64[in >> 12];
      in &= 0xFFF;
      cur_dest[2] = base64[in >> 6];
      in &= 0x3F;
      cur_dest[3] = base64[in];
      cur_dest += 4;
      break;
    }
    default:
      // Should not be reached: blocks of 4 bytes are handled
      // in the while loop before this switch statement.
      GOOGLE_LOG(FATAL) << "Logic problem? szsrc = " << szsrc;
      break;
  }
  return (cur_dest - dest);
}